

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  locale *plVar4;
  basic_format_specs<char> *pbVar5;
  bool bVar6;
  bool bVar7;
  char *__first;
  char cVar8;
  int iVar9;
  uint uVar10;
  numpunct *pnVar11;
  long lVar12;
  buffer_appender<char> bVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  buffer<char> *buf;
  long *plVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong size;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  long *local_2a0;
  long local_298;
  long local_290 [2];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar4 = (locale *)(this->locale).locale_;
  if (plVar4 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar4);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar11 + 0x20))(&local_2a0,pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (local_298 == 0) {
    on_dec(this);
  }
  else {
    plVar4 = (locale *)(this->locale).locale_;
    if (plVar4 == (locale *)0x0) {
      std::locale::locale((locale *)&local_248);
    }
    else {
      std::locale::locale((locale *)&local_248,plVar4);
    }
    pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
    cVar8 = (**(code **)(*(long *)pnVar11 + 0x18))(pnVar11);
    std::locale::~locale((locale *)&local_248);
    if (cVar8 != '\0') {
      uVar10 = this->abs_value;
      uVar3 = *(ushort *)(bsr2log10(int)::data + (ulong)(LZCOUNT(uVar10 | 1) ^ 0x1f) * 2);
      bVar7 = uVar10 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new + (ulong)uVar3 * 4);
      uVar21 = (uint)uVar3 - (uint)bVar7;
      uVar19 = uVar21;
      uVar15 = uVar21;
      if (local_298 != 0) {
        uVar19 = uVar21 + (int)local_298;
        lVar12 = 0;
        uVar14 = uVar21;
        do {
          cVar2 = *(char *)((long)local_2a0 + lVar12);
          uVar15 = uVar14 - (int)cVar2;
          if ((uVar15 == 0 || (int)uVar14 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) {
            iVar9 = (int)lVar12 + uVar21;
            goto LAB_001266ae;
          }
          lVar12 = lVar12 + 1;
          uVar14 = uVar15;
        } while (local_298 != lVar12);
      }
      iVar9 = (int)(uVar15 - 1) / (int)*(char *)((long)local_2a0 + local_298 + -1) + uVar19;
LAB_001266ae:
      pcVar16 = local_278 + (int)uVar21;
      uVar19 = uVar10;
      if (99 < uVar10) {
        do {
          uVar10 = uVar19 / 100;
          *(undefined2 *)(pcVar16 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar19 % 100) * 2);
          pcVar16 = pcVar16 + -2;
          bVar6 = 9999 < uVar19;
          uVar19 = uVar19 / 100;
        } while (bVar6);
      }
      if (uVar10 < 10) {
        pcVar16[-1] = (byte)uVar10 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar16 + -2) =
             *(undefined2 *)(basic_data<void>::digits + (ulong)uVar10 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00799960;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar10 = iVar9 + this->prefix_size;
      if (-1 < (int)uVar10) {
        size = (ulong)uVar10;
        if (500 < uVar10) {
          basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
        }
        __first = local_248.super_buffer<char>.ptr_;
        pcVar16 = local_248.super_buffer<char>.ptr_ + (size - 1);
        local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
        if (size <= local_248.super_buffer<char>.capacity_) {
          local_248.super_buffer<char>.size_ = size;
        }
        if (1 < (int)uVar21) {
          uVar18 = (ulong)uVar21;
          iVar9 = 0;
          iVar20 = (1 - (uint)bVar7) + (uint)uVar3;
          plVar17 = local_2a0;
          do {
            uVar18 = uVar18 - 1;
            pcVar1 = pcVar16 + -1;
            *pcVar16 = local_278[uVar18 & 0xffffffff];
            cVar2 = (char)*plVar17;
            if ('\0' < cVar2) {
              iVar9 = iVar9 + 1;
              if ((cVar2 != '\x7f') && (iVar9 % (int)cVar2 == 0)) {
                pcVar16[-1] = cVar8;
                if ((long *)((long)plVar17 + 1) != (long *)((long)local_2a0 + local_298)) {
                  iVar9 = 0;
                  plVar17 = (long *)((long)plVar17 + 1);
                }
                pcVar1 = pcVar16 + -2;
              }
            }
            pcVar16 = pcVar1;
            iVar20 = iVar20 + -1;
          } while (2 < iVar20);
        }
        *pcVar16 = local_278[0];
        if (this->prefix_size != 0) {
          pcVar16[-1] = '-';
        }
        pbVar5 = this->specs;
        uVar18 = (ulong)pbVar5->width;
        if (-1 < (long)uVar18) {
          bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
               (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          uVar22 = 0;
          if (size <= uVar18) {
            uVar22 = uVar18 - size;
          }
          cVar8 = *(char *)((long)&basic_data<void>::right_padding_shifts +
                           (ulong)((byte)pbVar5->field_0x9 & 0xf));
          local_280 = this;
          if (*(ulong *)((long)bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                               container + 0x18) <
              *(long *)((long)bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + size + (pbVar5->fill).size_ * uVar22) {
            (*(code *)**(undefined8 **)
                        bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                      (bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          }
          uVar18 = uVar22 >> ((long)cVar8 & 0x3fU);
          bVar13 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar13,uVar18,&pbVar5->fill);
          bVar13 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                             (__first,__first + size,bVar13);
          bVar13 = fill<fmt::v7::detail::buffer_appender<char>,char>
                             (bVar13,uVar22 - uVar18,&pbVar5->fill);
          (local_280->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
               (buffer<char> *)
               bVar13.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
          if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
            operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_
                           );
          }
          goto LAB_001268c3;
        }
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    on_dec(this);
  }
LAB_001268c3:
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }